

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void aggr_update(void)

{
  CHAR_DATA *pCVar1;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *pCVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  AFFECT_DATA *pAVar9;
  char *pcVar10;
  char *pcVar11;
  short sVar12;
  int iVar13;
  CHAR_DATA *pCVar14;
  CHAR_DATA *victim;
  CHAR_DATA *ch;
  CHAR_DATA *ch_00;
  char buf [4608];
  char local_1238 [4616];
  
  ch_00 = char_list;
  if (char_list != (CHAR_DATA *)0x0) {
    do {
      pCVar1 = ch_00->next;
      if ((ch_00->name != (char *)0x0) && (ch_00->in_room != (ROOM_INDEX_DATA *)0x0)) {
        bVar5 = is_npc(ch_00);
        if ((bVar5) && ((ch_00->progtypes[0] & 0x400) != 0)) {
          (*(code *)ch_00->pIndexData->mprogs->beat_prog)(ch_00);
        }
        for (pAVar9 = ch_00->affected; pAVar9 != (AFFECT_DATA *)0x0; pAVar9 = pAVar9->next) {
          if (pAVar9->beat_fun != (AFF_FUN *)0x0) {
            (*pAVar9->beat_fun)(ch_00,pAVar9);
          }
        }
        bVar5 = is_npc(ch_00);
        if ((bVar5) || (sVar12 = ch_00->pulseTimer, pc_race_table[ch_00->race].racePulse < sVar12))
        {
          bVar5 = is_npc(ch_00);
          sVar12 = ch_00->pulseTimer;
          if (sVar12 < 0xd && bVar5) goto LAB_002c2907;
        }
        else {
LAB_002c2907:
          sVar12 = sVar12 + 1;
          ch_00->pulseTimer = sVar12;
        }
        bVar5 = is_affected_by(ch_00,0x15);
        bVar6 = is_affected_by(ch_00,0x1d);
        if (ch_00->fighting != (CHAR_DATA *)0x0) {
          iVar13 = ((uint)bVar5 + (int)sVar12) - (uint)bVar6;
          bVar5 = is_npc(ch_00);
          if (((!bVar5) && (pc_race_table[ch_00->race].racePulse <= iVar13)) ||
             ((bVar5 = is_npc(ch_00), bVar5 && (0xb < iVar13)))) {
            update_pc_last_fight(ch_00,ch_00->fighting);
            bVar5 = is_awake(ch_00);
            if ((bVar5) && (ch_00->in_room == ch_00->fighting->in_room)) {
              multi_hit(ch_00,ch_00->fighting,-1);
            }
            else {
              stop_fighting(ch_00,false);
            }
            ch_00->pulseTimer = 0;
          }
        }
        if ((ch_00->position == 4) && ((ch_00->imm_flags[0] & 0x4000000) != 0)) {
          ch_00->position = 8;
        }
        bVar5 = is_affected_by(ch_00,0xe);
        if ((((bVar5) && (bVar5 = is_awake(ch_00), bVar5)) && (ch_00->fighting == (CHAR_DATA *)0x0))
           && ((ch_00->desc != (DESCRIPTOR_DATA *)0x0 || (bVar5 = is_npc(ch_00), bVar5)))) {
          pCVar3 = ch_00->in_room->people;
          do {
            do {
              pCVar14 = pCVar3;
              if (pCVar14 == (CHAR_DATA *)0x0) goto LAB_002c2a0d;
              pCVar3 = pCVar14->next_in_room;
            } while (((ch_00 == pCVar14) || (bVar5 = can_see(ch_00,pCVar14), !bVar5)) ||
                    (bVar5 = is_immortal(pCVar14), bVar5));
            iVar13 = skill_lookup("radiance");
            bVar5 = is_affected(pCVar14,iVar13);
          } while (((((bVar5) || (bVar5 = check_stealth(pCVar14,ch_00), bVar5)) ||
                    (bVar5 = is_safe_new(ch_00,pCVar14,false), bVar5)) ||
                   ((bVar5 = is_same_cabal(ch_00,pCVar14), bVar5 &&
                    (iVar13 = number_range(1,10000), 1 < iVar13)))) ||
                  (((bVar5 = is_same_group(ch_00,pCVar14), bVar5 && (bVar5 = is_npc(pCVar14), bVar5)
                    ) || ((bVar5 = is_npc(ch_00), bVar5 &&
                          (bVar5 = is_affected_by(ch_00,0x1e), bVar5))))));
          bVar5 = is_same_cabal(ch_00,pCVar14);
          if ((!bVar5) ||
             (pcVar8 = 
              "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r",
             ch_00->in_room->cabal == 3)) {
            pcVar8 = "%sYou charge into frenzied battle!%s\n\r";
          }
          pcVar10 = get_char_color(ch_00,"lightred");
          pcVar11 = END_COLOR(ch_00);
          sprintf(local_1238,pcVar8,pcVar10,pcVar11);
          send_to_char(local_1238,ch_00);
          do_murder(ch_00,pCVar14->name);
        }
LAB_002c2a0d:
        bVar5 = is_npc(ch_00);
        if ((((!bVar5) && (bVar5 = is_affected(ch_00,(int)gsn_divine_frenzy), bVar5)) &&
            (bVar5 = is_awake(ch_00), bVar5)) && (ch_00->fighting == (CHAR_DATA *)0x0)) {
          pCVar3 = ch_00->in_room->people;
          do {
            do {
              pCVar14 = pCVar3;
              if (pCVar14 == (CHAR_DATA *)0x0) goto LAB_002c2a46;
              pCVar3 = pCVar14->next_in_room;
              bVar5 = can_see(ch_00,pCVar14);
            } while (((ch_00 == pCVar14) || (!bVar5)) ||
                    ((bVar5 = check_stealth(pCVar14,ch_00), bVar5 ||
                     (bVar5 = is_safe_new(ch_00,pCVar14,false), bVar5))));
            iVar13 = skill_lookup("radiance");
            bVar5 = is_affected(pCVar14,iVar13);
          } while ((bVar5) || (bVar5 = is_evil(pCVar14), !bVar5));
          send_to_char("Righteous anger swells within you as you lash out at the wicked!\n\r",ch_00)
          ;
          do_murder(ch_00,pCVar14->name);
        }
LAB_002c2a46:
        bVar5 = is_affected(ch_00,(int)gsn_mark_of_wrath);
        if ((((bVar5) && (bVar5 = is_awake(ch_00), bVar5)) && (ch_00->fighting == (CHAR_DATA *)0x0))
           && ((ch_00->desc != (DESCRIPTOR_DATA *)0x0 || (bVar5 = is_npc(ch_00), bVar5)))) {
          pAVar9 = affect_find(ch_00->affected,(int)gsn_mark_of_wrath);
          pCVar3 = ch_00->in_room->people;
          do {
            do {
              pCVar14 = pCVar3;
              if (pCVar14 == (CHAR_DATA *)0x0) goto LAB_002c2a6d;
              pCVar3 = pCVar14->next_in_room;
              if (0 < pAVar9->owner->ghost) {
                affect_remove(ch_00,pAVar9);
              }
            } while ((ch_00 == pCVar14) || (bVar5 = can_see(ch_00,pCVar14), !bVar5));
            iVar13 = skill_lookup("radiance");
            bVar5 = is_affected(pCVar14,iVar13);
          } while ((bVar5) ||
                  ((bVar5 = is_safe_new(ch_00,pCVar14,false), bVar5 || (pCVar14 != pAVar9->owner))))
          ;
          pcVar10 = get_char_color(ch_00,"lightred");
          pcVar8 = pCVar14->name;
          pcVar11 = END_COLOR(ch_00);
          sprintf(local_1238,
                  "%sCatching sight of the mark upon %s\'s brow, you are consumed with wrath!%s\n\r"
                  ,pcVar10,pcVar8,pcVar11);
          send_to_char(local_1238,ch_00);
          do_murder(ch_00,pCVar14->name);
        }
LAB_002c2a6d:
        bVar5 = is_npc(ch_00);
        if ((((!bVar5) && (ch_00->level < 0x34)) &&
            (pRVar2 = ch_00->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)) &&
           (pRVar2->area->empty == false)) {
          pCVar3 = pRVar2->people;
          while (pCVar14 = pCVar3, pCVar14 != (CHAR_DATA *)0x0) {
            pCVar3 = pCVar14->next_in_room;
            bVar5 = is_npc(pCVar14);
            if ((((((bVar5) && ((pCVar14->act[0] & 0x20) != 0)) &&
                  (((pCVar14->in_room->room_flags[0] & 0x400) == 0 &&
                   ((bVar5 = is_npc(pCVar14), !bVar5 ||
                    (bVar5 = is_affected_by(pCVar14,0x1e), !bVar5)))))) &&
                 (bVar5 = is_affected_by(pCVar14,0x16), !bVar5)) &&
                ((((pCVar14->fighting == (CHAR_DATA *)0x0 &&
                   (bVar5 = is_affected_by(pCVar14,0x12), !bVar5)) &&
                  (bVar5 = is_awake(pCVar14), bVar5)) &&
                 (((pCVar14->act[0] & 0x80) == 0 || (bVar5 = is_awake(ch_00), !bVar5)))))) &&
               ((bVar5 = can_see(pCVar14,ch_00), bVar5 &&
                ((iVar13 = number_bits(1), iVar13 != 0 &&
                 (ch = ch_00->in_room->people, ch != (CHAR_DATA *)0x0)))))) {
              iVar13 = 0;
              victim = (CHAR_DATA *)0x0;
              do {
                pCVar4 = ch->next_in_room;
                bVar5 = is_npc(ch);
                if (((((((!bVar5) && (ch->level < 0x34)) && (bVar5 = is_heroimm(ch), !bVar5)) &&
                      (ch->level + -5 <= (int)pCVar14->level)) &&
                     (((pCVar14->act[0] & 0x80) == 0 || (bVar5 = is_awake(ch), !bVar5)))) &&
                    ((bVar5 = can_see(pCVar14,ch), bVar5 &&
                     ((2 < sun || (pCVar14->act[1] & 1) == 0 &&
                      ((ushort)(sun - 3U) < 0xfffe || (pCVar14->act[0] & 0x80000000) == 0)))))) &&
                   (bVar5 = is_safe_new(pCVar14,ch,false), !bVar5)) {
                  iVar7 = skill_lookup("radiance");
                  bVar5 = is_affected(ch,iVar7);
                  if (!bVar5) {
                    iVar7 = number_range(0,iVar13);
                    if (iVar7 == 0) {
                      victim = ch;
                    }
                    iVar13 = iVar13 + 1;
                  }
                }
                ch = pCVar4;
              } while (pCVar4 != (CHAR_DATA *)0x0);
              if (victim != (CHAR_DATA *)0x0) {
                multi_hit(pCVar14,victim,-1);
              }
            }
          }
        }
      }
      ch_00 = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void aggr_update(void)
{
	CHAR_DATA *wch;
	CHAR_DATA *wch_next;
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	CHAR_DATA *victim;
	AFFECT_DATA *paf;
	int timer;
	char buf[MAX_STRING_LENGTH];

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (!wch->name)
			continue;

		if (!wch->in_room)
			continue;

		if (is_npc(wch) && IS_SET(wch->progtypes, MPROG_BEAT))
			(wch->pIndexData->mprogs->beat_prog)(wch);

		for (paf = wch->affected; paf; paf = paf->next)
		{
			if (paf->beat_fun)
				(*paf->beat_fun)(wch, paf);
		}

		if ((!is_npc(wch) && wch->pulseTimer <= pc_race_table[wch->race].racePulse)
			|| (is_npc(wch) && wch->pulseTimer <= 12))
			wch->pulseTimer++;

		timer = wch->pulseTimer;

		if (is_affected_by(wch, AFF_HASTE))
			timer++;

		if (is_affected_by(wch, AFF_SLOW))
			timer--;

		if (wch->fighting &&
			((!is_npc(wch) && timer >= pc_race_table[wch->race].racePulse) || (is_npc(wch) && timer >= 12)))
		{
			update_pc_last_fight(wch, wch->fighting);

			if (is_awake(wch) && wch->in_room == wch->fighting->in_room)
				multi_hit(wch, wch->fighting, TYPE_UNDEFINED);
			else
				stop_fighting(wch, false);

			wch->pulseTimer = 0;
		}

		if (wch->position == POS_SLEEPING && IS_SET(wch->imm_flags, IMM_SLEEP))
			wch->position = POS_STANDING;

		if (is_affected_by(wch, AFF_RAGE) && is_awake(wch) && !wch->fighting && !(wch->desc == nullptr && !is_npc(wch)))
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (wch != vch && can_see(wch, vch) && !is_immortal(vch))
				{
					if (is_affected(vch, skill_lookup("radiance")))
						continue;

					if (check_stealth(vch, wch))
						continue;

					if (is_safe_new(wch, vch, false))
						continue;

					if (is_same_cabal(wch, vch) && number_range(1, 10000) > 1)
						continue;

					if (is_same_group(wch, vch) && is_npc(vch))
						continue;

					if (is_npc(wch) && is_affected_by(wch, AFF_NOSHOW))
						continue;

					if (is_same_cabal(wch, vch) && wch->in_room->cabal != CABAL_HORDE)
					{
						sprintf(buf, "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}
					else
					{
						sprintf(buf, "%sYou charge into frenzied battle!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}

					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (!is_npc(wch) && is_affected(wch, gsn_divine_frenzy) && is_awake(wch) && !wch->fighting)
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!can_see(wch, vch) || wch == vch)
					continue;

				if (check_stealth(vch, wch))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (!is_evil(vch))
					continue;

				send_to_char("Righteous anger swells within you as you lash out at the wicked!\n\r", wch);
				do_murder(wch, vch->name);
				break;
			}
		}

		if (is_affected(wch, gsn_mark_of_wrath)
			&& is_awake(wch)
			&& !wch->fighting
			&& !(wch->desc == nullptr && !is_npc(wch)))
		{
			paf = affect_find(wch->affected, gsn_mark_of_wrath);

			for (vch = wch->in_room->people; vch; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (paf->owner->ghost > 0)
					affect_remove(wch, paf);

				if (wch == vch || !can_see(wch, vch))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (vch == paf->owner)
				{
					sprintf(buf, "%sCatching sight of the mark upon %s's brow, you are consumed with wrath!%s\n\r",
						get_char_color(wch, "lightred"),
						vch->name,
						END_COLOR(wch));
					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (is_npc(wch) || wch->level >= LEVEL_IMMORTAL || wch->in_room == nullptr || wch->in_room->area->empty)
			continue;

		for (ch = wch->in_room->people; ch != nullptr; ch = ch_next)
		{
			int count;

			ch_next = ch->next_in_room;

			if (!is_npc(ch)
				|| !IS_SET(ch->act, ACT_AGGRESSIVE)
				|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
				|| (is_npc(ch) && is_affected_by(ch, AFF_NOSHOW))
				|| is_affected_by(ch, AFF_CALM)
				|| ch->fighting != nullptr
				|| is_affected_by(ch, AFF_CHARM)
				|| !is_awake(ch)
				|| (IS_SET(ch->act, ACT_WIMPY) && is_awake(wch))
				|| !can_see(ch, wch)
				|| number_bits(1) == 0)
			{
				continue;
			}

			/*
			 * Ok we have a 'wch' player character and a 'ch' npc aggressor.
			 * Now make the aggressor fight a RANDOM pc victim in the room,
			 *   giving each 'vch' an equal chance of selection.
			 */
			count = 0;
			victim = nullptr;

			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!is_npc(vch)
					&& vch->level < LEVEL_IMMORTAL
					&& !is_heroimm(vch)
					&& ch->level >= vch->level - 5
					&& (!IS_SET(ch->act, ACT_WIMPY) || !is_awake(vch))
					&& can_see(ch, vch)
					&& (!IS_SET(ch->act, ACT_DIURNAL) || sun >= SolarPosition::Sunset)
					&& (!IS_SET(ch->act, ACT_NOCTURNAL) || (sun != SolarPosition::Sunrise && sun != SolarPosition::Daylight))
					&& !is_safe_new(ch, vch, false)
					&& !is_affected(vch, skill_lookup("radiance")))
				{
					if (number_range(0, count) == 0)
						victim = vch;

					count++;
				}
			}

			if (victim == nullptr)
				continue;

			multi_hit(ch, victim, TYPE_UNDEFINED);
		}
	}
}